

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdf-set-form-values.cc
# Opt level: O1

int main(int argc,char **argv)

{
  char *pcVar1;
  char *__s;
  QPDFPageObjectHelper QVar2;
  QPDFAnnotationObjectHelper QVar3;
  long lVar4;
  int iVar5;
  undefined8 extraout_RAX;
  long *plVar6;
  ostream *poVar7;
  char *pcVar8;
  long lVar9;
  int extraout_EDX;
  long lVar10;
  QPDF qpdf;
  QPDFWriter w;
  QPDFAcroFormDocumentHelper afdh;
  undefined1 in_stack_fffffffffffffe78 [24];
  undefined1 *in_stack_fffffffffffffe90;
  undefined8 in_stack_fffffffffffffe98;
  long in_stack_fffffffffffffea0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_fffffffffffffea8;
  char *local_150;
  long local_128;
  long local_120;
  long local_110;
  long local_108;
  undefined1 local_f8 [56];
  undefined **local_c0 [2];
  long local_b0;
  undefined8 local_a8;
  long local_a0;
  element_type *local_98;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_90;
  undefined **local_88 [2];
  long local_78;
  undefined8 local_70;
  long local_68;
  element_type *local_60;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_58;
  QPDFAcroFormDocumentHelper local_50;
  
  whoami = (char *)QUtil::getWhoami(*argv);
  if (argc == 4) {
    pcVar8 = argv[1];
    pcVar1 = argv[2];
    __s = argv[3];
    QPDF::QPDF((QPDF *)&stack0xfffffffffffffe88);
    QPDF::processFile(&stack0xfffffffffffffe88,pcVar8);
    QPDFAcroFormDocumentHelper::QPDFAcroFormDocumentHelper
              (&local_50,(QPDF *)&stack0xfffffffffffffe88);
    QPDFPageDocumentHelper::QPDFPageDocumentHelper
              ((QPDFPageDocumentHelper *)local_f8,(QPDF *)&stack0xfffffffffffffe88);
    QPDFPageDocumentHelper::getAllPages();
    QPDFPageDocumentHelper::~QPDFPageDocumentHelper((QPDFPageDocumentHelper *)local_f8);
    if (local_110 != local_108) {
      lVar9 = local_110;
      do {
        local_c0[1] = *(undefined ***)(lVar9 + 8);
        local_b0 = *(long *)(lVar9 + 0x10);
        if (local_b0 != 0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(int *)(local_b0 + 8) = *(int *)(local_b0 + 8) + 1;
            UNLOCK();
          }
          else {
            *(int *)(local_b0 + 8) = *(int *)(local_b0 + 8) + 1;
          }
        }
        local_a8 = *(undefined8 *)(lVar9 + 0x18);
        local_a0 = *(long *)(lVar9 + 0x20);
        if (local_a0 != 0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(int *)(local_a0 + 8) = *(int *)(local_a0 + 8) + 1;
            UNLOCK();
          }
          else {
            *(int *)(local_a0 + 8) = *(int *)(local_a0 + 8) + 1;
          }
        }
        local_c0[0] = &PTR__QPDFPageObjectHelper_00104cb8;
        local_98 = *(element_type **)(lVar9 + 0x28);
        local_90._M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar9 + 0x30);
        if (local_90._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(int *)(local_90._M_pi + 8) = *(int *)(local_90._M_pi + 8) + 1;
            UNLOCK();
          }
          else {
            *(int *)(local_90._M_pi + 8) = *(int *)(local_90._M_pi + 8) + 1;
          }
        }
        QVar2._24_8_ = in_stack_fffffffffffffe90;
        QVar2.super_QPDFObjectHelper = (QPDFObjectHelper)in_stack_fffffffffffffe78[0];
        QVar2._1_8_ = in_stack_fffffffffffffe78._1_8_;
        QVar2._9_8_ = in_stack_fffffffffffffe78._9_8_;
        QVar2._17_7_ = in_stack_fffffffffffffe78._17_7_;
        QVar2._32_8_ = in_stack_fffffffffffffe98;
        QVar2.m.super___shared_ptr<QPDFPageObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             = (element_type *)in_stack_fffffffffffffea0;
        QVar2.m.super___shared_ptr<QPDFPageObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = in_stack_fffffffffffffea8._M_pi;
        QPDFAcroFormDocumentHelper::getWidgetAnnotationsForPage(QVar2);
        QPDFPageObjectHelper::~QPDFPageObjectHelper((QPDFPageObjectHelper *)local_c0);
        lVar4 = local_120;
        for (lVar10 = local_128; lVar10 != lVar4; lVar10 = lVar10 + 0x38) {
          local_88[1] = *(undefined ***)(lVar10 + 8);
          local_78 = *(long *)(lVar10 + 0x10);
          if (local_78 != 0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              *(int *)(local_78 + 8) = *(int *)(local_78 + 8) + 1;
              UNLOCK();
            }
            else {
              *(int *)(local_78 + 8) = *(int *)(local_78 + 8) + 1;
            }
          }
          local_70 = *(undefined8 *)(lVar10 + 0x18);
          local_68 = *(long *)(lVar10 + 0x20);
          if (local_68 != 0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              *(int *)(local_68 + 8) = *(int *)(local_68 + 8) + 1;
              UNLOCK();
            }
            else {
              *(int *)(local_68 + 8) = *(int *)(local_68 + 8) + 1;
            }
          }
          local_88[0] = &PTR__QPDFAnnotationObjectHelper_00104cf0;
          local_60 = *(element_type **)(lVar10 + 0x28);
          local_58._M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar10 + 0x30);
          if (local_58._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              *(int *)(local_58._M_pi + 8) = *(int *)(local_58._M_pi + 8) + 1;
              UNLOCK();
            }
            else {
              *(int *)(local_58._M_pi + 8) = *(int *)(local_58._M_pi + 8) + 1;
            }
          }
          QVar3._24_8_ = in_stack_fffffffffffffe90;
          QVar3.super_QPDFObjectHelper = (QPDFObjectHelper)in_stack_fffffffffffffe78[0];
          QVar3._1_8_ = in_stack_fffffffffffffe78._1_8_;
          QVar3._9_8_ = in_stack_fffffffffffffe78._9_8_;
          QVar3._17_7_ = in_stack_fffffffffffffe78._17_7_;
          QVar3._32_8_ = in_stack_fffffffffffffe98;
          QVar3.m.
          super___shared_ptr<QPDFAnnotationObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               = (element_type *)in_stack_fffffffffffffea0;
          QVar3.m.
          super___shared_ptr<QPDFAnnotationObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = in_stack_fffffffffffffea8._M_pi;
          QPDFAcroFormDocumentHelper::getFieldForAnnotation(QVar3);
          QPDFAnnotationObjectHelper::~QPDFAnnotationObjectHelper
                    ((QPDFAnnotationObjectHelper *)local_88);
          QPDFFormFieldObjectHelper::getFieldType_abi_cxx11_();
          iVar5 = std::__cxx11::string::compare((char *)&stack0xfffffffffffffe90);
          if (in_stack_fffffffffffffe90 != &stack0xfffffffffffffea0) {
            operator_delete(in_stack_fffffffffffffe90,in_stack_fffffffffffffea0 + 1);
          }
          if (iVar5 == 0) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&stack0xfffffffffffffe90,__s,
                       (allocator<char> *)&stack0xfffffffffffffe87);
            QPDFFormFieldObjectHelper::setV
                      ((string *)local_f8,SUB81((string *)&stack0xfffffffffffffe90,0));
            if (in_stack_fffffffffffffe90 != &stack0xfffffffffffffea0) {
              operator_delete(in_stack_fffffffffffffe90,in_stack_fffffffffffffea0 + 1);
            }
            QPDFFormFieldObjectHelper::generateAppearance((QPDFAnnotationObjectHelper *)local_f8);
          }
          QPDFFormFieldObjectHelper::~QPDFFormFieldObjectHelper
                    ((QPDFFormFieldObjectHelper *)local_f8);
        }
        std::vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_>::
        ~vector((vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_> *)
                &local_128);
        lVar9 = lVar9 + 0x38;
      } while (lVar9 != local_108);
    }
    std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::~vector
              ((vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *)&local_110);
    QPDFWriter::QPDFWriter((QPDFWriter *)local_f8,(QPDF *)&stack0xfffffffffffffe88,pcVar1);
    QPDFWriter::setStaticID(SUB81(local_f8,0));
    QPDFWriter::write();
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._8_8_);
    }
    QPDFAcroFormDocumentHelper::~QPDFAcroFormDocumentHelper(&local_50);
    QPDF::~QPDF((QPDF *)&stack0xfffffffffffffe88);
    return 0;
  }
  usage();
  QPDFAcroFormDocumentHelper::~QPDFAcroFormDocumentHelper(&local_50);
  QPDF::~QPDF((QPDF *)&stack0xfffffffffffffe88);
  if (extraout_EDX == 1) {
    plVar6 = (long *)__cxa_begin_catch(extraout_RAX);
    poVar7 = std::operator<<((ostream *)&std::cerr,whoami);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," processing file ",0x11);
    poVar7 = std::operator<<(poVar7,local_150);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,": ",2);
    pcVar8 = (char *)(**(code **)(*plVar6 + 0x10))(plVar6);
    poVar7 = std::operator<<(poVar7,pcVar8);
    std::endl<char,std::char_traits<char>>(poVar7);
    exit(2);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

int
main(int argc, char* argv[])
{
    whoami = QUtil::getWhoami(argv[0]);

    if (argc != 4) {
        usage();
    }

    char const* infilename = argv[1];
    char const* outfilename = argv[2];
    char const* value = argv[3];

    // This is a contrived example that just goes through a file page by page and sets the value of
    // any text fields it finds to a fixed value as given on the command line. The purpose here is
    // to illustrate use of the helper classes around interactive forms.

    try {
        QPDF qpdf;
        qpdf.processFile(infilename);

        // We will iterate through form fields by starting at the page level and looking at each
        // field for each page. We could also call QPDFAcroFormDocumentHelper::getFormFields to
        // iterate at the field level, but doing it as below illustrates how we can map from
        // annotations to fields.

        QPDFAcroFormDocumentHelper afdh(qpdf);
        for (auto const& page: QPDFPageDocumentHelper(qpdf).getAllPages()) {
            // Get all widget annotations for each page. Widget annotations are the ones that
            // contain the details of what's in a form field.
            for (auto& annot: afdh.getWidgetAnnotationsForPage(page)) {
                // For each annotation, find its associated field. If it's a text field, set its
                // value.
                QPDFFormFieldObjectHelper ffh = afdh.getFieldForAnnotation(annot);
                if (ffh.getFieldType() == "/Tx") {
                    // Set the value. Passing false as the second parameter prevents qpdf from
                    // setting /NeedAppearances to true (but will not turn it off if it's already
                    // on), so we call generateAppearance after setting the value. You may or may
                    // not want to do this depending on whether the appearance streams generated by
                    // qpdf are good enough for your purposes. For additional details, please see
                    // comments in QPDFFormFieldObjectHelper.hh for this method.
                    ffh.setV(value, false);
                    ffh.generateAppearance(annot);
                }
            }
        }

        // Write out a new file
        QPDFWriter w(qpdf, outfilename);
        w.setStaticID(true); // for testing only
        w.write();
    } catch (std::exception& e) {
        std::cerr << whoami << " processing file " << infilename << ": " << e.what() << std::endl;
        exit(2);
    }

    return 0;
}